

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::WriteLocalAllRules
          (cmLocalUnixMakefileGenerator3 *this,ostream *ruleFileStream)

{
  cmTarget *this_00;
  cmOutputConverter *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  _Alloc_hider _Var4;
  pointer pbVar5;
  pointer pbVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  long *plVar11;
  long *plVar12;
  cmMakefile *pcVar13;
  pointer pbVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  _Hash_node_base *p_Var16;
  string recursiveTarget;
  string mf2Dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string runRule;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string local_1e8;
  string progressDir;
  string cmakefileName;
  ios_base local_138 [264];
  
  WriteDisclaimer(this,ruleFileStream);
  recursiveTarget.field_2._M_allocated_capacity = 0;
  recursiveTarget._M_dataplus._M_p = (pointer)0x0;
  recursiveTarget._M_string_length = 0;
  progressDir.field_2._M_allocated_capacity = 0;
  progressDir._M_dataplus._M_p = (pointer)0x0;
  progressDir._M_string_length = 0;
  paVar15 = &cmakefileName.field_2;
  cmakefileName._M_dataplus._M_p = (pointer)paVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"all","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&recursiveTarget,
             &cmakefileName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar15) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  cmakefileName._M_dataplus._M_p = (pointer)paVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"default_target","");
  WriteMakeRule(this,ruleFileStream,"Default target executed when no arguments are given to make.",
                &cmakefileName,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&recursiveTarget,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&progressDir,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar15) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  iVar8 = (*((this->super_cmLocalGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[0x26])();
  if ((char)iVar8 != '\0') {
    mf2Dir._M_dataplus._M_p = (pointer)0x0;
    mf2Dir._M_string_length = 0;
    mf2Dir.field_2._M_allocated_capacity = 0;
    cmakefileName._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,".NOTPARALLEL","");
    WriteMakeRule(this,ruleFileStream,
                  "Allow only one \"make -f Makefile2\" at a time, but pass parallelism.",
                  &cmakefileName,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mf2Dir,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&progressDir,false,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmakefileName._M_dataplus._M_p != paVar15) {
      operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1
                     );
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&mf2Dir);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&progressDir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&recursiveTarget);
  WriteSpecialTargetsTop(this,ruleFileStream);
  std::__ostream_insert<char,std::char_traits<char>>
            (ruleFileStream,"#======================================",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            (ruleFileStream,"=======================================\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (ruleFileStream,"# Targets provided globally by CMake.\n",0x26);
  std::__ostream_insert<char,std::char_traits<char>>(ruleFileStream,"\n",1);
  pcVar13 = (this->super_cmLocalGenerator).Makefile;
  p_Var16 = (pcVar13->Targets)._M_h._M_before_begin._M_nxt;
  if (p_Var16 != (_Hash_node_base *)0x0) {
    do {
      if (*(int *)&p_Var16[0x61]._M_nxt == 6) {
        std::operator+(&cmakefileName,"Special rule for the target ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var16 + 1));
        mf2Dir.field_2._M_allocated_capacity = 0;
        mf2Dir._M_dataplus._M_p = (pointer)0x0;
        mf2Dir._M_string_length = 0;
        runRule.field_2._M_allocated_capacity = 0;
        runRule._M_dataplus._M_p = (pointer)0x0;
        runRule._M_string_length = 0;
        recursiveTarget._M_dataplus._M_p = (pointer)&recursiveTarget.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&recursiveTarget,"EchoString","");
        this_00 = (cmTarget *)(p_Var16 + 5);
        pcVar9 = cmTarget::GetProperty(this_00,&recursiveTarget);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)recursiveTarget._M_dataplus._M_p != &recursiveTarget.field_2) {
          operator_delete(recursiveTarget._M_dataplus._M_p,
                          recursiveTarget.field_2._M_allocated_capacity + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&runRule,
                   runRule._M_string_length,p_Var16[0x1a]._M_nxt,p_Var16 + 0x18);
        if (pcVar9 == (char *)0x0) {
          pcVar9 = "Running external command ...";
        }
        recursiveTarget._M_dataplus._M_p = (pointer)&recursiveTarget.field_2;
        sVar10 = strlen(pcVar9);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&recursiveTarget,pcVar9,pcVar9 + sVar10);
        AppendEcho(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&mf2Dir,&recursiveTarget,EchoGlobal,(EchoProgress *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)recursiveTarget._M_dataplus._M_p != &recursiveTarget.field_2) {
          operator_delete(recursiveTarget._M_dataplus._M_p,
                          recursiveTarget.field_2._M_allocated_capacity + 1);
        }
        AppendCustomDepends(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&runRule,
                            (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)
                            (p_Var16 + 0x4d));
        AppendCustomDepends(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&runRule,
                            (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)
                            (p_Var16 + 0x53));
        AppendCustomCommands
                  (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&mf2Dir,
                   (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)(p_Var16 + 0x4d),
                   this_00,START_OUTPUT);
        AppendCustomCommands
                  (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&mf2Dir,
                   (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)(p_Var16 + 0x53),
                   this_00,START_OUTPUT);
        recursiveTarget._M_dataplus._M_p = (pointer)&recursiveTarget.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&recursiveTarget,p_Var16[0x3a]._M_nxt,
                   (long)&(p_Var16[0x3a]._M_nxt)->_M_nxt + (long)&(p_Var16[0x3b]._M_nxt)->_M_nxt);
        WriteMakeRule(this,ruleFileStream,cmakefileName._M_dataplus._M_p,&recursiveTarget,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&runRule,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&mf2Dir,true,false);
        sVar3 = runRule._M_string_length;
        _Var4 = runRule._M_dataplus;
        if ((pointer)runRule._M_string_length != runRule._M_dataplus._M_p) {
          plVar12 = (long *)(runRule._M_dataplus._M_p + 0x10);
          do {
            if (plVar12 != (long *)plVar12[-2]) {
              operator_delete((long *)plVar12[-2],*plVar12 + 1);
            }
            plVar11 = plVar12 + 2;
            plVar12 = plVar12 + 4;
          } while (plVar11 != (long *)sVar3);
          runRule._M_string_length = (size_type)_Var4._M_p;
        }
        iVar8 = std::__cxx11::string::compare((char *)&recursiveTarget);
        if (((iVar8 == 0) ||
            (iVar8 = std::__cxx11::string::compare((char *)&recursiveTarget), iVar8 == 0)) ||
           (iVar8 = std::__cxx11::string::compare((char *)&recursiveTarget), iVar8 == 0)) {
          progressDir._M_dataplus._M_p = (pointer)&progressDir.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&progressDir,"preinstall/fast","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&runRule,
                     &progressDir);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)progressDir._M_dataplus._M_p != &progressDir.field_2) {
            operator_delete(progressDir._M_dataplus._M_p,
                            progressDir.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&runRule,&recursiveTarget);
          sVar3 = mf2Dir._M_string_length;
          _Var4 = mf2Dir._M_dataplus;
          if ((pointer)mf2Dir._M_string_length != mf2Dir._M_dataplus._M_p) {
            plVar12 = (long *)(mf2Dir._M_dataplus._M_p + 0x10);
            do {
              if (plVar12 != (long *)plVar12[-2]) {
                operator_delete((long *)plVar12[-2],*plVar12 + 1);
              }
              plVar11 = plVar12 + 2;
              plVar12 = plVar12 + 4;
            } while (plVar11 != (long *)sVar3);
            mf2Dir._M_string_length = (size_type)_Var4._M_p;
          }
        }
        std::__cxx11::string::append((char *)&recursiveTarget);
        WriteMakeRule(this,ruleFileStream,cmakefileName._M_dataplus._M_p,&recursiveTarget,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&runRule,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&mf2Dir,true,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)recursiveTarget._M_dataplus._M_p != &recursiveTarget.field_2) {
          operator_delete(recursiveTarget._M_dataplus._M_p,
                          recursiveTarget.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&runRule);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mf2Dir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cmakefileName._M_dataplus._M_p != &cmakefileName.field_2) {
          operator_delete(cmakefileName._M_dataplus._M_p,
                          cmakefileName.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var16 = p_Var16->_M_nxt;
    } while (p_Var16 != (_Hash_node_base *)0x0);
    pcVar13 = (this->super_cmLocalGenerator).Makefile;
  }
  paVar15 = &cmakefileName.field_2;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar9 = cmMakefile::GetCurrentBinaryDirectory(pcVar13);
  std::__cxx11::string::string((string *)&recursiveTarget,pcVar9,(allocator *)&cmakefileName);
  std::__cxx11::string::append((char *)&recursiveTarget);
  cmakefileName._M_dataplus._M_p = (pointer)paVar15;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&cmakefileName,"cmake_check_build_system","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
             &cmakefileName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar15) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  pcVar9 = cmMakefile::GetHomeOutputDirectory((this->super_cmLocalGenerator).Makefile);
  std::__cxx11::string::string((string *)&progressDir,pcVar9,(allocator *)&cmakefileName);
  std::__cxx11::string::append((char *)&progressDir);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmakefileName);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&cmakefileName,"$(CMAKE_COMMAND) -E cmake_progress_start ",0x29);
  this_01 = &(this->super_cmLocalGenerator).super_cmOutputConverter;
  cmOutputConverter::Convert(&mf2Dir,this_01,&progressDir,FULL,SHELL);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&cmakefileName,mf2Dir._M_dataplus._M_p,mf2Dir._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mf2Dir._M_dataplus._M_p != &mf2Dir.field_2) {
    operator_delete(mf2Dir._M_dataplus._M_p,mf2Dir.field_2._M_allocated_capacity + 1);
  }
  mf2Dir._M_dataplus._M_p = (pointer)&mf2Dir.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&mf2Dir,"/CMakeFiles","");
  std::__cxx11::string::append((char *)&mf2Dir);
  ConvertToFullPath(&runRule,this,&mf2Dir);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&cmakefileName," ",1);
  cmOutputConverter::Convert(&local_1e8,this_01,&runRule,FULL,SHELL);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&cmakefileName,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  paVar1 = &local_1e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
             &local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &runRule.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)runRule._M_dataplus._M_p != paVar2) {
    operator_delete(runRule._M_dataplus._M_p,runRule.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mf2Dir._M_dataplus._M_p != &mf2Dir.field_2) {
    operator_delete(mf2Dir._M_dataplus._M_p,mf2Dir.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmakefileName);
  std::ios_base::~ios_base(local_138);
  mf2Dir._M_dataplus._M_p = (pointer)&mf2Dir.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&mf2Dir,"CMakeFiles/","");
  std::__cxx11::string::append((char *)&mf2Dir);
  GetRecursiveMakeCall(&cmakefileName,this,mf2Dir._M_dataplus._M_p,&recursiveTarget);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
             &cmakefileName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar15) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  pcVar9 = cmMakefile::GetHomeOutputDirectory((this->super_cmLocalGenerator).Makefile);
  CreateCDCommand(this,&commands,pcVar9,START_OUTPUT);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmakefileName);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&cmakefileName,"$(CMAKE_COMMAND) -E cmake_progress_start ",0x29);
  cmOutputConverter::Convert(&runRule,this_01,&progressDir,FULL,SHELL);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&cmakefileName,runRule._M_dataplus._M_p,runRule._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)runRule._M_dataplus._M_p != paVar2) {
    operator_delete(runRule._M_dataplus._M_p,runRule.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&cmakefileName," 0",2);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,&runRule
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)runRule._M_dataplus._M_p != paVar2) {
    operator_delete(runRule._M_dataplus._M_p,runRule.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmakefileName);
  std::ios_base::~ios_base(local_138);
  cmakefileName._M_dataplus._M_p = (pointer)paVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"all","");
  WriteMakeRule(this,ruleFileStream,"The main all target",&cmakefileName,&depends,&commands,true,
                false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar15) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  pcVar9 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmLocalGenerator).Makefile);
  sVar3 = recursiveTarget._M_string_length;
  strlen(pcVar9);
  std::__cxx11::string::_M_replace((ulong)&recursiveTarget,0,(char *)sVar3,(ulong)pcVar9);
  std::__cxx11::string::append((char *)&recursiveTarget);
  pbVar6 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar5 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar15 = &(commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar12 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar15 + -1))->_M_dataplus)._M_p;
      if (paVar15 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        operator_delete(plVar12,paVar15->_M_allocated_capacity + 1);
      }
      pbVar14 = (pointer)(paVar15 + 1);
      paVar15 = paVar15 + 2;
    } while (pbVar14 != pbVar6);
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  }
  pbVar6 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar5 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar15 = &(depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar12 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar15 + -1))->_M_dataplus)._M_p;
      if (paVar15 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        operator_delete(plVar12,paVar15->_M_allocated_capacity + 1);
      }
      pbVar14 = (pointer)(paVar15 + 1);
      paVar15 = paVar15 + 2;
    } while (pbVar14 != pbVar6);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  }
  GetRecursiveMakeCall(&cmakefileName,this,mf2Dir._M_dataplus._M_p,&recursiveTarget);
  paVar15 = &cmakefileName.field_2;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
             &cmakefileName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar15) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  pcVar9 = cmMakefile::GetHomeOutputDirectory((this->super_cmLocalGenerator).Makefile);
  CreateCDCommand(this,&commands,pcVar9,START_OUTPUT);
  cmakefileName._M_dataplus._M_p = (pointer)paVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"clean","");
  WriteMakeRule(this,ruleFileStream,"The main clean target",&cmakefileName,&depends,&commands,true,
                false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar15) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  pbVar6 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar5 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar15 = &(commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar12 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar15 + -1))->_M_dataplus)._M_p;
      if (paVar15 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        operator_delete(plVar12,paVar15->_M_allocated_capacity + 1);
      }
      pbVar14 = (pointer)(paVar15 + 1);
      paVar15 = paVar15 + 2;
    } while (pbVar14 != pbVar6);
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  }
  pbVar6 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar5 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar15 = &(depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar12 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar15 + -1))->_M_dataplus)._M_p;
      if (paVar15 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        operator_delete(plVar12,paVar15->_M_allocated_capacity + 1);
      }
      pbVar14 = (pointer)(paVar15 + 1);
      paVar15 = paVar15 + 2;
    } while (pbVar14 != pbVar6);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  }
  paVar15 = &cmakefileName.field_2;
  cmakefileName._M_dataplus._M_p = (pointer)paVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"clean","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
             &cmakefileName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar15) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  cmakefileName._M_dataplus._M_p = (pointer)paVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"clean/fast","");
  WriteMakeRule(this,ruleFileStream,"The main clean target",&cmakefileName,&depends,&commands,true,
                false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar15) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  pcVar9 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmLocalGenerator).Makefile);
  sVar3 = recursiveTarget._M_string_length;
  strlen(pcVar9);
  std::__cxx11::string::_M_replace((ulong)&recursiveTarget,0,(char *)sVar3,(ulong)pcVar9);
  std::__cxx11::string::append((char *)&recursiveTarget);
  pbVar6 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar5 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar15 = &(commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar12 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar15 + -1))->_M_dataplus)._M_p;
      if (paVar15 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        operator_delete(plVar12,paVar15->_M_allocated_capacity + 1);
      }
      pbVar14 = (pointer)(paVar15 + 1);
      paVar15 = paVar15 + 2;
    } while (pbVar14 != pbVar6);
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  }
  pbVar6 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar5 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar15 = &(depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar12 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar15 + -1))->_M_dataplus)._M_p;
      if (paVar15 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        operator_delete(plVar12,paVar15->_M_allocated_capacity + 1);
      }
      pbVar14 = (pointer)(paVar15 + 1);
      paVar15 = paVar15 + 2;
    } while (pbVar14 != pbVar6);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  }
  pcVar13 = (this->super_cmLocalGenerator).Makefile;
  paVar15 = &cmakefileName.field_2;
  cmakefileName._M_dataplus._M_p = (pointer)paVar15;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&cmakefileName,"CMAKE_SKIP_INSTALL_ALL_DEPENDENCY","");
  pcVar9 = cmMakefile::GetDefinition(pcVar13,&cmakefileName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar15) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  if ((pcVar9 == (char *)0x0) || (bVar7 = cmSystemTools::IsOff(pcVar9), bVar7)) {
    cmakefileName._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"all","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
               &cmakefileName);
  }
  else {
    cmakefileName._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&cmakefileName,"cmake_check_build_system","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
               &cmakefileName);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar15) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  GetRecursiveMakeCall(&cmakefileName,this,mf2Dir._M_dataplus._M_p,&recursiveTarget);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
             &cmakefileName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar15) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  pcVar9 = cmMakefile::GetHomeOutputDirectory((this->super_cmLocalGenerator).Makefile);
  CreateCDCommand(this,&commands,pcVar9,START_OUTPUT);
  cmakefileName._M_dataplus._M_p = (pointer)paVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"preinstall","");
  WriteMakeRule(this,ruleFileStream,"Prepare targets for installation.",&cmakefileName,&depends,
                &commands,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != paVar15) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  pbVar6 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar5 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar15 = &(depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar12 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar15 + -1))->_M_dataplus)._M_p;
      if (paVar15 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        operator_delete(plVar12,paVar15->_M_allocated_capacity + 1);
      }
      pbVar14 = (pointer)(paVar15 + 1);
      paVar15 = paVar15 + 2;
    } while (pbVar14 != pbVar6);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  }
  cmakefileName._M_dataplus._M_p = (pointer)&cmakefileName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"preinstall/fast","");
  WriteMakeRule(this,ruleFileStream,"Prepare targets for installation.",&cmakefileName,&depends,
                &commands,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != &cmakefileName.field_2) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  pbVar6 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar5 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar15 = &(depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar12 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar15 + -1))->_M_dataplus)._M_p;
      if (paVar15 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        operator_delete(plVar12,paVar15->_M_allocated_capacity + 1);
      }
      pbVar14 = (pointer)(paVar15 + 1);
      paVar15 = paVar15 + 2;
    } while (pbVar14 != pbVar6);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  }
  pbVar6 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar5 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar15 = &(commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar12 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar15 + -1))->_M_dataplus)._M_p;
      if (paVar15 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        operator_delete(plVar12,paVar15->_M_allocated_capacity + 1);
      }
      pbVar14 = (pointer)(paVar15 + 1);
      paVar15 = paVar15 + 2;
    } while (pbVar14 != pbVar6);
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  }
  cmakefileName._M_dataplus._M_p = (pointer)&cmakefileName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"CMakeFiles/","");
  std::__cxx11::string::append((char *)&cmakefileName);
  runRule._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&runRule,"$(CMAKE_COMMAND) -H$(CMAKE_SOURCE_DIR) -B$(CMAKE_BINARY_DIR)","");
  std::__cxx11::string::append((char *)&runRule);
  cmOutputConverter::Convert(&local_1e8,this_01,&cmakefileName,NONE,SHELL);
  std::__cxx11::string::_M_append((char *)&runRule,(ulong)local_1e8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&runRule);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&commands,&runRule);
  pcVar9 = cmMakefile::GetHomeOutputDirectory((this->super_cmLocalGenerator).Makefile);
  CreateCDCommand(this,&commands,pcVar9,START_OUTPUT);
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"depend","");
  WriteMakeRule(this,ruleFileStream,"clear depends",&local_1e8,&depends,&commands,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)runRule._M_dataplus._M_p != paVar2) {
    operator_delete(runRule._M_dataplus._M_p,runRule.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != &cmakefileName.field_2) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mf2Dir._M_dataplus._M_p != &mf2Dir.field_2) {
    operator_delete(mf2Dir._M_dataplus._M_p,mf2Dir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)progressDir._M_dataplus._M_p != &progressDir.field_2) {
    operator_delete(progressDir._M_dataplus._M_p,progressDir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)recursiveTarget._M_dataplus._M_p != &recursiveTarget.field_2) {
    operator_delete(recursiveTarget._M_dataplus._M_p,
                    recursiveTarget.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3
::WriteLocalAllRules(std::ostream& ruleFileStream)
{
  this->WriteDisclaimer(ruleFileStream);

  // Write the main entry point target.  This must be the VERY first
  // target so that make with no arguments will run it.
  {
  // Just depend on the all target to drive the build.
  std::vector<std::string> depends;
  std::vector<std::string> no_commands;
  depends.push_back("all");

  // Write the rule.
  this->WriteMakeRule(ruleFileStream,
                      "Default target executed when no arguments are "
                      "given to make.",
                      "default_target",
                      depends,
                      no_commands, true);

  // Help out users that try "gmake target1 target2 -j".
  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  if(gg->AllowNotParallel())
    {
    std::vector<std::string> no_depends;
    this->WriteMakeRule(ruleFileStream,
      "Allow only one \"make -f Makefile2\" at a time, but pass parallelism.",
      ".NOTPARALLEL", no_depends, no_commands, false);
    }
  }

  this->WriteSpecialTargetsTop(ruleFileStream);

  // Include the progress variables for the target.
  // Write all global targets
  this->WriteDivider(ruleFileStream);
  ruleFileStream
    << "# Targets provided globally by CMake.\n"
    << "\n";
  cmTargets* targets = &(this->Makefile->GetTargets());
  cmTargets::iterator glIt;
  for ( glIt = targets->begin(); glIt != targets->end(); ++ glIt )
    {
    if ( glIt->second.GetType() == cmTarget::GLOBAL_TARGET )
      {
      std::string targetString = "Special rule for the target " + glIt->first;
      std::vector<std::string> commands;
      std::vector<std::string> depends;

      const char* text = glIt->second.GetProperty("EchoString");
      if ( !text )
        {
        text = "Running external command ...";
        }
      depends.insert(depends.end(), glIt->second.GetUtilities().begin(),
                     glIt->second.GetUtilities().end());
      this->AppendEcho(commands, text,
                       cmLocalUnixMakefileGenerator3::EchoGlobal);

      // Global targets store their rules in pre- and post-build commands.
      this->AppendCustomDepends(depends,
                                glIt->second.GetPreBuildCommands());
      this->AppendCustomDepends(depends,
                                glIt->second.GetPostBuildCommands());
      this->AppendCustomCommands(commands,
                                 glIt->second.GetPreBuildCommands(),
                                 &glIt->second,
                                 cmLocalGenerator::START_OUTPUT);
      this->AppendCustomCommands(commands,
                                 glIt->second.GetPostBuildCommands(),
                                 &glIt->second,
                                 cmLocalGenerator::START_OUTPUT);
      std::string targetName = glIt->second.GetName();
      this->WriteMakeRule(ruleFileStream, targetString.c_str(),
                          targetName, depends, commands, true);

      // Provide a "/fast" version of the target.
      depends.clear();
      if((targetName == "install")
          || (targetName == "install_local")
          || (targetName == "install_strip"))
        {
        // Provide a fast install target that does not depend on all
        // but has the same command.
        depends.push_back("preinstall/fast");
        }
      else
        {
        // Just forward to the real target so at least it will work.
        depends.push_back(targetName);
        commands.clear();
        }
      targetName += "/fast";
      this->WriteMakeRule(ruleFileStream, targetString.c_str(),
                          targetName, depends, commands, true);
      }
    }

  std::vector<std::string> depends;
  std::vector<std::string> commands;

  // Write the all rule.
  std::string recursiveTarget = this->Makefile->GetCurrentBinaryDirectory();
  recursiveTarget += "/all";

  depends.push_back("cmake_check_build_system");

  std::string progressDir = this->Makefile->GetHomeOutputDirectory();
  progressDir += cmake::GetCMakeFilesDirectory();
    {
    std::ostringstream progCmd;
    progCmd <<
      "$(CMAKE_COMMAND) -E cmake_progress_start ";
    progCmd << this->Convert(progressDir,
                             cmLocalGenerator::FULL,
                             cmLocalGenerator::SHELL);

    std::string progressFile = cmake::GetCMakeFilesDirectory();
    progressFile += "/progress.marks";
    std::string progressFileNameFull =
      this->ConvertToFullPath(progressFile);
    progCmd << " " << this->Convert(progressFileNameFull,
                                    cmLocalGenerator::FULL,
                                    cmLocalGenerator::SHELL);
    commands.push_back(progCmd.str());
    }
  std::string mf2Dir = cmake::GetCMakeFilesDirectoryPostSlash();
  mf2Dir += "Makefile2";
  commands.push_back(this->GetRecursiveMakeCall(mf2Dir.c_str(),
                                                recursiveTarget));
  this->CreateCDCommand(commands,
                        this->Makefile->GetHomeOutputDirectory(),
                        cmLocalGenerator::START_OUTPUT);
    {
    std::ostringstream progCmd;
    progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start "; // # 0
    progCmd << this->Convert(progressDir,
                             cmLocalGenerator::FULL,
                             cmLocalGenerator::SHELL);
    progCmd << " 0";
    commands.push_back(progCmd.str());
    }
  this->WriteMakeRule(ruleFileStream, "The main all target", "all",
                      depends, commands, true);

  // Write the clean rule.
  recursiveTarget = this->Makefile->GetCurrentBinaryDirectory();
  recursiveTarget += "/clean";
  commands.clear();
  depends.clear();
  commands.push_back(this->GetRecursiveMakeCall(mf2Dir.c_str(),
                                                recursiveTarget));
  this->CreateCDCommand(commands,
                                this->Makefile->GetHomeOutputDirectory(),
                                cmLocalGenerator::START_OUTPUT);
  this->WriteMakeRule(ruleFileStream, "The main clean target", "clean",
                      depends, commands, true);
  commands.clear();
  depends.clear();
  depends.push_back("clean");
  this->WriteMakeRule(ruleFileStream, "The main clean target", "clean/fast",
                      depends, commands, true);

  // Write the preinstall rule.
  recursiveTarget = this->Makefile->GetCurrentBinaryDirectory();
  recursiveTarget += "/preinstall";
  commands.clear();
  depends.clear();
  const char* noall =
    this->Makefile->GetDefinition("CMAKE_SKIP_INSTALL_ALL_DEPENDENCY");
  if(!noall || cmSystemTools::IsOff(noall))
    {
    // Drive the build before installing.
    depends.push_back("all");
    }
  else
    {
    // At least make sure the build system is up to date.
    depends.push_back("cmake_check_build_system");
    }
  commands.push_back
    (this->GetRecursiveMakeCall(mf2Dir.c_str(), recursiveTarget));
  this->CreateCDCommand(commands,
                        this->Makefile->GetHomeOutputDirectory(),
                        cmLocalGenerator::START_OUTPUT);
  this->WriteMakeRule(ruleFileStream, "Prepare targets for installation.",
                      "preinstall", depends, commands, true);
  depends.clear();
  this->WriteMakeRule(ruleFileStream, "Prepare targets for installation.",
                      "preinstall/fast", depends, commands, true);

  // write the depend rule, really a recompute depends rule
  depends.clear();
  commands.clear();
  std::string cmakefileName = cmake::GetCMakeFilesDirectoryPostSlash();
  cmakefileName += "Makefile.cmake";
  std::string runRule =
    "$(CMAKE_COMMAND) -H$(CMAKE_SOURCE_DIR) -B$(CMAKE_BINARY_DIR)";
  runRule += " --check-build-system ";
  runRule += this->Convert(cmakefileName,cmLocalGenerator::NONE,
                           cmLocalGenerator::SHELL);
  runRule += " 1";
  commands.push_back(runRule);
  this->CreateCDCommand(commands,
                        this->Makefile->GetHomeOutputDirectory(),
                        cmLocalGenerator::START_OUTPUT);
  this->WriteMakeRule(ruleFileStream, "clear depends",
                      "depend",
                      depends, commands, true);
}